

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char (*) [99]
util::str<char[36],char[99],char[2],int>
          (char (*args) [36],char (*args_1) [99],char (*args_2) [2],int *args_3)

{
  char (*in_RDI) [99];
  ostringstream ss;
  char (*args_00) [99];
  ostringstream *this;
  ostream *in_stack_fffffffffffffe50;
  ostringstream local_1a0 [416];
  
  this = local_1a0;
  args_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(this);
  detail::_str<char[36],char[99],char[2],int>
            (in_stack_fffffffffffffe50,(char (*) [36])this,args_00,(char (*) [2])in_RDI,
             (int *)0x1b4f84);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return args_00;
}

Assistant:

inline std::string str(const Args&... args) {
  std::ostringstream ss;
  detail::_str(ss, args...);
  return ss.str();
}